

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void standard_image_validate(standard_display *dp,png_const_structp pp,int iImage,int iDisplay)

{
  uint local_24;
  png_uint_32 y;
  int iDisplay_local;
  int iImage_local;
  png_const_structp pp_local;
  standard_display *dp_local;
  
  if (-1 < iImage) {
    store_image_check(dp->ps,pp,iImage);
  }
  if (-1 < iDisplay) {
    store_image_check(dp->ps,pp,iDisplay);
  }
  for (local_24 = 0; local_24 < dp->h; local_24 = local_24 + 1) {
    standard_row_validate(dp,pp,iImage,iDisplay,local_24);
  }
  dp->ps->field_0x18 = dp->ps->field_0x18 & 0x7f | 0x80;
  return;
}

Assistant:

static void
standard_image_validate(standard_display *dp, png_const_structp pp, int iImage,
    int iDisplay)
{
   png_uint_32 y;

   if (iImage >= 0)
      store_image_check(dp->ps, pp, iImage);

   if (iDisplay >= 0)
      store_image_check(dp->ps, pp, iDisplay);

   for (y=0; y<dp->h; ++y)
      standard_row_validate(dp, pp, iImage, iDisplay, y);

   /* This avoids false positives if the validation code is never called! */
   dp->ps->validated = 1;
}